

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O2

void __thiscall EventLoop::removeFromPoller(EventLoop *this,shared_ptr<Channel> *channel)

{
  Epoll *this_00;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = (this->poller_).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
  Epoll::epoll_del(this_00,(SP_Channel *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void removeFromPoller(shared_ptr<Channel> channel) {
    // shutDownWR(channel->getFd());
    poller_->epoll_del(channel);
  }